

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  ImU32 IVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  bool held;
  bool hovered;
  bool local_72;
  bool local_71;
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImVec2 local_58;
  ImVec2 local_50;
  ImRect local_48;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  IVar1 = *pos;
  fVar10 = IVar1.x;
  fVar12 = IVar1.y;
  fVar9 = GImGui->FontSize;
  IVar2 = (GImGui->Style).FramePadding;
  fVar11 = IVar2.x;
  fVar13 = IVar2.y;
  local_38 = fVar11 + fVar11 + fVar9 + fVar10;
  fStack_34 = fVar13 + fVar13 + fVar9 + fVar12;
  fStack_30 = fVar9 + 0.0 + 0.0;
  fStack_2c = fVar9 + 0.0 + 0.0;
  local_48.Max.x = local_38;
  local_48.Min = IVar1;
  local_48.Max.y = fStack_34;
  IVar2 = (pIVar4->OuterRectClipped).Min;
  IVar3 = (pIVar4->OuterRectClipped).Max;
  local_68._8_8_ = 0;
  local_68._0_4_ = IVar1.x;
  local_68._4_4_ = IVar1.y;
  if (((IVar3.y - IVar2.y) * (IVar3.x - IVar2.x)) / ((fStack_34 - fVar12) * (local_38 - fVar10)) <
      1.5) {
    fVar9 = (float)(int)((local_38 - fVar10) * -0.25);
    fVar11 = (float)(int)((fStack_34 - fVar12) * -0.25);
    local_48.Min.y = fVar12 - fVar11;
    local_48.Min.x = fVar10 - fVar9;
    local_48.Max.x = fVar9 + local_38;
    local_48.Max.y = fVar11 + fStack_34;
  }
  bVar6 = ItemAdd(&local_48,id,(ImRect *)0x0,0);
  bVar7 = ButtonBehavior(&local_48,id,&local_71,&local_72,0);
  if (bVar6) {
    IVar8 = GetColorU32(local_72 | 0x16,1.0);
    local_70.x = ((float)local_68._0_4_ + local_38) * 0.5;
    local_70.y = ((float)local_68._4_4_ + fStack_34) * 0.5;
    if (local_71 == true) {
      fVar10 = pIVar5->FontSize * 0.5 + 1.0;
      fVar9 = 2.0;
      if (2.0 <= fVar10) {
        fVar9 = fVar10;
      }
      ImDrawList::AddCircleFilled(pIVar4->DrawList,&local_70,fVar9,IVar8,0xc);
    }
    local_68 = ZEXT416((uint)(pIVar5->FontSize * 0.5 * 0.7071 + -1.0));
    IVar8 = GetColorU32(0,1.0);
    local_70.x = local_70.x + -0.5;
    local_70.y = local_70.y + -0.5;
    local_50.y = (float)local_68._0_4_ + local_70.y;
    local_50.x = (float)local_68._0_4_ + local_70.x;
    local_58.y = local_70.y - (float)local_68._0_4_;
    local_58.x = local_70.x - (float)local_68._0_4_;
    ImDrawList::AddLine(pIVar4->DrawList,&local_50,&local_58,IVar8,1.0);
    local_50.y = local_70.y - (float)local_68._0_4_;
    local_50.x = (float)local_68._0_4_ + local_70.x;
    local_58.y = (float)local_68._0_4_ + local_70.y;
    local_58.x = local_70.x - (float)local_68._0_4_;
    ImDrawList::AddLine(pIVar4->DrawList,&local_50,&local_58,IVar8,1.0);
  }
  return bVar7;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Tweak 1: Shrink hit-testing area if button covers an abnormally large proportion of the visible region. That's in order to facilitate moving the window away. (#3825)
    // This may better be applied as a general hit-rect reduction mechanism for all widgets to ensure the area to move window is always accessible?
    const ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ImRect bb_interact = bb;
    const float area_to_visible_ratio = window->OuterRectClipped.GetArea() / bb.GetArea();
    if (area_to_visible_ratio < 1.5f)
        bb_interact.Expand(ImFloor(bb_interact.GetSize() * -0.25f));

    // Tweak 2: We intentionally allow interaction when clipped so that a mechanical Alt,Right,Activate sequence can always close a window.
    // (this isn't the regular behavior of buttons, but it doesn't affect the user much because navigation tends to keep items visible).
    bool is_clipped = !ItemAdd(bb_interact, id);

    bool hovered, held;
    bool pressed = ButtonBehavior(bb_interact, id, &hovered, &held);
    if (is_clipped)
        return pressed;

    // Render
    // FIXME: Clarify this mess
    ImU32 col = GetColorU32(held ? ImGuiCol_ButtonActive : ImGuiCol_ButtonHovered);
    ImVec2 center = bb.GetCenter();
    if (hovered)
        window->DrawList->AddCircleFilled(center, ImMax(2.0f, g.FontSize * 0.5f + 1.0f), col, 12);

    float cross_extent = g.FontSize * 0.5f * 0.7071f - 1.0f;
    ImU32 cross_col = GetColorU32(ImGuiCol_Text);
    center -= ImVec2(0.5f, 0.5f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent, +cross_extent), center + ImVec2(-cross_extent, -cross_extent), cross_col, 1.0f);
    window->DrawList->AddLine(center + ImVec2(+cross_extent, -cross_extent), center + ImVec2(-cross_extent, +cross_extent), cross_col, 1.0f);

    return pressed;
}